

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int nextScaffoldPart(XML_Parser parser)

{
  long lVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  
  if (*(long *)((long)parser + 0x3c0) == 0) {
    puVar5 = (undefined4 *)
             (**(code **)((long)parser + 0x18))((ulong)*(uint *)((long)parser + 0x480) << 2);
    *(undefined4 **)((long)parser + 0x3c0) = puVar5;
    if (puVar5 != (undefined4 *)0x0) {
      *puVar5 = 0;
      goto LAB_004cd247;
    }
LAB_004cd2fb:
    iVar4 = -1;
  }
  else {
LAB_004cd247:
    if (*(uint *)((long)parser + 0x3b4) <= *(uint *)((long)parser + 0x3b8)) {
      if (*(long *)((long)parser + 0x3a8) == 0) {
        *(undefined4 *)((long)parser + 0x3b4) = 0x20;
        lVar6 = (**(code **)((long)parser + 0x18))(0x400);
      }
      else {
        uVar3 = *(uint *)((long)parser + 0x3b4) * 2;
        *(uint *)((long)parser + 0x3b4) = uVar3;
        lVar6 = (**(code **)((long)parser + 0x20))
                          (*(long *)((long)parser + 0x3a8),(ulong)uVar3 << 5);
      }
      *(long *)((long)parser + 0x3a8) = lVar6;
      if (lVar6 == 0) goto LAB_004cd2fb;
    }
    iVar4 = *(int *)((long)parser + 0x3b8);
    *(int *)((long)parser + 0x3b8) = iVar4 + 1;
    lVar6 = *(long *)((long)parser + 0x3a8);
    if ((long)*(int *)((long)parser + 0x3bc) != 0) {
      lVar7 = (long)*(int *)(*(long *)((long)parser + 0x3c0) + -4 +
                            (long)*(int *)((long)parser + 0x3bc) * 4) * 0x20;
      lVar1 = lVar6 + lVar7;
      lVar7 = (long)*(int *)(lVar6 + 0x14 + lVar7);
      if (lVar7 != 0) {
        *(int *)(lVar6 + 0x1c + lVar7 * 0x20) = iVar4;
      }
      if (*(int *)(lVar1 + 0x18) == 0) {
        *(int *)(lVar1 + 0x10) = iVar4;
      }
      *(int *)(lVar1 + 0x14) = iVar4;
      *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) + 1;
    }
    puVar2 = (undefined8 *)(lVar6 + 0x10 + (long)iVar4 * 0x20);
    *puVar2 = 0;
    puVar2[1] = 0;
  }
  return iVar4;
}

Assistant:

static int
nextScaffoldPart(XML_Parser parser)
{
  CONTENT_SCAFFOLD * me;
  int next;

  if (! dtd.scaffIndex) {
    dtd.scaffIndex = MALLOC(groupSize * sizeof(int));
    if (! dtd.scaffIndex)
      return -1;
    dtd.scaffIndex[0] = 0;
  }

  if (dtd.scaffCount >= dtd.scaffSize) {
    if (dtd.scaffold) {
      dtd.scaffSize *= 2;
      dtd.scaffold = (CONTENT_SCAFFOLD *) REALLOC(dtd.scaffold,
                                              dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    else {
      dtd.scaffSize = 32;
      dtd.scaffold = (CONTENT_SCAFFOLD *) MALLOC(dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    if (! dtd.scaffold)
      return -1;
  }
  next = dtd.scaffCount++;
  me = &dtd.scaffold[next];
  if (dtd.scaffLevel) { 
    CONTENT_SCAFFOLD *parent = &dtd.scaffold[dtd.scaffIndex[dtd.scaffLevel - 1]];
    if (parent->lastchild) {
      dtd.scaffold[parent->lastchild].nextsib = next;
    }
    if (! parent->childcnt)
      parent->firstchild = next;
    parent->lastchild = next;
    parent->childcnt++;
  }
  me->firstchild = me->lastchild = me->childcnt = me->nextsib = 0;
  return next;
}